

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# detectionoutput.cpp
# Opt level: O3

int __thiscall
ncnn::DetectionOutput::forward
          (DetectionOutput *this,vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *bottom_blobs,
          vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *top_blobs,Option *opt)

{
  BBoxRect *pBVar1;
  vector<ncnn::BBoxRect,std::allocator<ncnn::BBoxRect>> *this_00;
  vector<float,std::allocator<float>> *this_01;
  size_t __size;
  float fVar2;
  float fVar3;
  undefined4 uVar4;
  undefined8 uVar5;
  undefined4 uVar6;
  pointer pMVar7;
  void *pvVar8;
  void *pvVar9;
  unsigned_long uVar10;
  iterator __position;
  iterator __position_00;
  Mat *this_02;
  size_t sVar11;
  bool bVar12;
  pointer pfVar13;
  pointer pfVar14;
  DetectionOutput *pDVar15;
  size_type sVar16;
  pointer pvVar17;
  int iVar18;
  int *piVar19;
  undefined1 auVar20 [8];
  float *pfVar21;
  BBoxRect *pBVar22;
  int iVar23;
  long lVar24;
  size_type __new_size;
  uint uVar25;
  ulong uVar26;
  int iVar27;
  void *pvVar28;
  size_type sVar29;
  ulong uVar30;
  long lVar31;
  float fVar32;
  float fVar33;
  undefined4 extraout_XMM0_Db;
  float fVar34;
  float fVar35;
  float fVar36;
  float fVar37;
  float fVar38;
  vector<float,_std::allocator<float>_> bbox_scores;
  vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_> bbox_rects;
  vector<unsigned_long,_std::allocator<unsigned_long>_> picked;
  vector<float,_std::allocator<float>_> class_bbox_scores;
  vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
  all_class_bbox_scores;
  vector<std::vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>,_std::allocator<std::vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>_>_>
  all_class_bbox_rects;
  vector<float,_std::allocator<float>_> local_1a8;
  undefined1 local_188 [8];
  undefined8 uStack_180;
  pointer local_178;
  unsigned_long *local_168;
  iterator iStack_160;
  unsigned_long *local_158;
  DetectionOutput *local_148;
  unsigned_long local_140;
  vector<float,_std::allocator<float>_> local_138;
  ulong local_120;
  ulong local_118;
  int local_10c;
  undefined8 local_108;
  size_type local_f8;
  pointer local_f0;
  vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
  local_e8;
  long local_c8;
  undefined8 uStack_c0;
  undefined8 local_b8;
  undefined8 uStack_b0;
  pointer local_a8;
  float *pfStack_a0;
  long local_98;
  undefined4 local_90;
  Allocator *local_88;
  undefined8 local_80;
  uint local_78;
  undefined4 local_74;
  long local_70;
  vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *local_68;
  Option *local_60;
  float *local_58;
  float *local_50;
  vector<std::vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>,_std::allocator<std::vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>_>_>
  local_48;
  
  pMVar7 = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
           super__Vector_impl_data._M_start;
  iVar23 = this->num_class;
  if (iVar23 == -0xe9) {
    local_78 = pMVar7[2].h;
  }
  else {
    iVar18 = pMVar7[2].w;
    iVar27 = iVar18 + 3;
    if (-1 < iVar18) {
      iVar27 = iVar18;
    }
    local_78 = iVar27 >> 2;
  }
  local_118 = (ulong)local_78;
  piVar19 = &this->num_class;
  if (iVar23 == -0xe9) {
    piVar19 = &pMVar7[1].h;
  }
  local_f8 = (size_type)*piVar19;
  local_88 = opt->workspace_allocator;
  local_a8 = (pointer)0x0;
  pfStack_a0 = (float *)0x0;
  local_98 = 4;
  local_90 = 1;
  local_80 = 0x400000002;
  local_74 = 1;
  lVar24 = (long)(int)(local_78 * 4);
  if (local_78 == 0) {
    iVar23 = -100;
  }
  else {
    __size = lVar24 * 4 + 4;
    local_70 = lVar24;
    if (local_88 == (Allocator *)0x0) {
      local_188 = (undefined1  [8])0x0;
      iVar18 = posix_memalign((void **)local_188,0x10,__size);
      auVar20 = (undefined1  [8])(pointer)0x0;
      if (iVar18 == 0) {
        auVar20 = local_188;
      }
    }
    else {
      auVar20 = (undefined1  [8])(**(code **)(*(long *)local_88 + 0x10))(local_88,__size);
    }
    pfStack_a0 = &((pointer)auVar20)->xmin + lVar24;
    (&((pointer)auVar20)->xmin)[lVar24] = 1.4013e-45;
    pvVar8 = pMVar7[2].data;
    if (iVar23 == -0xe9) {
      pvVar28 = (void *)0x0;
    }
    else {
      pvVar28 = (void *)((long)pMVar7[2].w * pMVar7[2].elemsize + (long)pvVar8);
    }
    local_120 = local_118 & 0xffffffff;
    local_148 = this;
    local_10c = iVar23;
    local_f0 = pMVar7;
    local_a8 = (pointer)auVar20;
    local_68 = top_blobs;
    local_60 = opt;
    local_58 = pfStack_a0;
    if (0 < (int)local_118) {
      pvVar9 = pMVar7->data;
      local_50 = this->variances;
      lVar24 = local_120 << 4;
      lVar31 = 0;
      do {
        pfVar21 = (float *)((long)pvVar28 + lVar31);
        if (pvVar28 == (void *)0x0) {
          pfVar21 = local_50;
        }
        uVar5 = *(undefined8 *)((long)pvVar9 + lVar31);
        local_b8 = CONCAT44((float)((ulong)uVar5 >> 0x20) *
                            (float)((ulong)*(undefined8 *)pfVar21 >> 0x20),
                            (float)uVar5 * (float)*(undefined8 *)pfVar21);
        uStack_b0 = 0;
        uVar5 = *(undefined8 *)((long)pvVar9 + lVar31 + 8);
        fVar33 = (float)((ulong)uVar5 >> 0x20) *
                 (float)((ulong)*(undefined8 *)(pfVar21 + 2) >> 0x20);
        local_c8 = CONCAT44(fVar33,(float)uVar5 * (float)*(undefined8 *)(pfVar21 + 2));
        uStack_c0 = 0;
        fVar33 = expf(fVar33);
        local_108 = CONCAT44(extraout_XMM0_Db,fVar33);
        fVar33 = expf((float)local_c8);
        pfVar21 = (float *)((long)pvVar8 + lVar31);
        fVar35 = pfVar21[2] - *pfVar21;
        fVar36 = pfVar21[3] - pfVar21[1];
        fVar32 = (*pfVar21 + pfVar21[2]) * 0.5 + fVar35 * (float)local_b8;
        fVar34 = (pfVar21[1] + pfVar21[3]) * 0.5 + fVar36 * local_b8._4_4_;
        fVar33 = fVar33 * fVar35 * 0.5;
        fVar35 = (float)local_108 * fVar36 * 0.5;
        pfVar21 = (float *)((long)&((pointer)auVar20)->xmin + lVar31);
        *pfVar21 = fVar32 - fVar33;
        pfVar21[1] = fVar34 - fVar35;
        pfVar21[2] = fVar32 + fVar33;
        pfVar21[3] = fVar34 + fVar35;
        lVar31 = lVar31 + 0x10;
      } while (lVar24 != lVar31);
    }
    __new_size = local_f8;
    local_48.
    super__Vector_base<std::vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>,_std::allocator<std::vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_48.
    super__Vector_base<std::vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>,_std::allocator<std::vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_48.
    super__Vector_base<std::vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>,_std::allocator<std::vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_e8.
    super__Vector_base<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_e8.
    super__Vector_base<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_e8.
    super__Vector_base<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    std::
    vector<std::vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>,_std::allocator<std::vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>_>_>
    ::resize(&local_48,local_f8);
    std::
    vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
    ::resize(&local_e8,__new_size);
    if ((int)__new_size < 2) {
      local_188 = (undefined1  [8])0x0;
      uStack_180 = (pointer)0x0;
      local_178 = (pointer)0x0;
      local_1a8.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage = (pointer)0x0;
      local_1a8.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_start = (pointer)0x0;
      local_1a8.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_finish = (pointer)0x0;
    }
    else {
      sVar29 = 1;
      if (local_10c == -0xe9) {
        __new_size = 1;
      }
      uVar26 = 1;
      if (local_10c == -0xe9) {
        uVar26 = local_120;
      }
      local_108 = uVar26 << 2;
      local_c8 = local_108;
      do {
        uVar26 = local_120;
        local_1a8.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
        _M_start = (pointer)0x0;
        local_1a8.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
        _M_finish = (pointer)0x0;
        local_1a8.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
        _M_end_of_storage = (pointer)0x0;
        local_138.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
        _M_end_of_storage = (float *)0x0;
        local_138.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
        _M_start = (pointer)0x0;
        local_138.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
        _M_finish = (float *)0x0;
        if (0 < (int)local_118) {
          uVar30 = 0;
          lVar24 = local_108;
          do {
            fVar33 = *(float *)((long)local_f0[1].data + lVar24);
            local_168 = (unsigned_long *)CONCAT44(local_168._4_4_,fVar33);
            if (local_148->confidence_threshold <= fVar33 &&
                fVar33 != local_148->confidence_threshold) {
              lVar31 = (long)(int)uVar30 * (long)local_80._4_4_ * local_98;
              local_188._4_4_ = *(float *)((long)&local_a8->ymin + lVar31);
              local_188._0_4_ = *(float *)((long)&local_a8->xmin + lVar31);
              uStack_180 = (pointer)CONCAT44(*(float *)((long)&local_a8->ymax + lVar31),
                                             *(float *)((long)&local_a8->xmax + lVar31));
              local_178 = (pointer)CONCAT44(local_178._4_4_,(int)sVar29);
              if (local_1a8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                  super__Vector_impl_data._M_finish ==
                  local_1a8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage) {
                std::vector<ncnn::BBoxRect,std::allocator<ncnn::BBoxRect>>::
                _M_realloc_insert<ncnn::BBoxRect_const&>
                          ((vector<ncnn::BBoxRect,std::allocator<ncnn::BBoxRect>> *)&local_1a8,
                           (iterator)
                           local_1a8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                           super__Vector_impl_data._M_finish,(BBoxRect *)local_188);
              }
              else {
                *(int *)((long)local_1a8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                               super__Vector_impl_data._M_finish + 0x10) = (int)sVar29;
                *(undefined1 (*) [8])
                 local_1a8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                 super__Vector_impl_data._M_finish = local_188;
                *(pointer *)
                 ((long)local_1a8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                        super__Vector_impl_data._M_finish + 8) = uStack_180;
                local_1a8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                super__Vector_impl_data._M_finish =
                     (pointer)((long)local_1a8.super__Vector_base<float,_std::allocator<float>_>.
                                     _M_impl.super__Vector_impl_data._M_finish + 0x14);
              }
              if (local_138.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                  super__Vector_impl_data._M_finish ==
                  local_138.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage) {
                std::vector<float,std::allocator<float>>::_M_realloc_insert<float_const&>
                          ((vector<float,std::allocator<float>> *)&local_138,
                           (iterator)
                           local_138.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                           super__Vector_impl_data._M_finish,(float *)&local_168);
              }
              else {
                *local_138.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                 super__Vector_impl_data._M_finish = local_168._0_4_;
                local_138.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                super__Vector_impl_data._M_finish =
                     local_138.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                     super__Vector_impl_data._M_finish + 1;
              }
            }
            uVar30 = uVar30 + 1;
            lVar24 = lVar24 + __new_size * 4;
          } while (uVar26 != uVar30);
        }
        qsort_descent_inplace<ncnn::BBoxRect>
                  ((vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_> *)&local_1a8,&local_138)
        ;
        pDVar15 = local_148;
        iVar23 = local_148->nms_top_k;
        iVar18 = (int)((ulong)((long)local_1a8.super__Vector_base<float,_std::allocator<float>_>.
                                     _M_impl.super__Vector_impl_data._M_finish -
                              (long)local_1a8.super__Vector_base<float,_std::allocator<float>_>.
                                    _M_impl.super__Vector_impl_data._M_start) >> 2);
        if (SBORROW4(iVar23,iVar18 * -0x33333333) != iVar23 + iVar18 * 0x33333333 < 0) {
          std::vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>::resize
                    ((vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_> *)&local_1a8,
                     (long)iVar23);
          std::vector<float,_std::allocator<float>_>::resize(&local_138,(long)pDVar15->nms_top_k);
        }
        pfVar14 = local_1a8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                  super__Vector_impl_data._M_finish;
        pfVar13 = local_1a8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                  super__Vector_impl_data._M_start;
        local_168 = (unsigned_long *)0x0;
        iStack_160._M_current = (unsigned_long *)0x0;
        local_158 = (unsigned_long *)0x0;
        local_b8 = CONCAT44(local_b8._4_4_,pDVar15->nms_threshold);
        uVar26 = ((long)local_1a8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                        super__Vector_impl_data._M_finish -
                  (long)local_1a8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                        super__Vector_impl_data._M_start >> 2) * -0x3333333333333333;
        std::vector<float,_std::allocator<float>_>::vector
                  ((vector<float,_std::allocator<float>_> *)local_188,uVar26,
                   (allocator_type *)&local_140);
        if (pfVar14 != pfVar13) {
          pfVar21 = (float *)((long)local_1a8.super__Vector_base<float,_std::allocator<float>_>.
                                    _M_impl.super__Vector_impl_data._M_start + 8);
          lVar24 = 0;
          do {
            uVar4 = ((BBoxRect *)(pfVar21 + -2))->xmin;
            uVar6 = ((BBoxRect *)(pfVar21 + -2))->ymin;
            ((float *)local_188)[lVar24] =
                 ((float)((ulong)*(undefined8 *)pfVar21 >> 0x20) - (float)uVar6) *
                 ((float)*(undefined8 *)pfVar21 - (float)uVar4);
            lVar24 = lVar24 + 1;
            pfVar21 = pfVar21 + 5;
          } while (uVar26 + (uVar26 == 0) != lVar24);
          local_140 = 0;
          do {
            uVar25 = (uint)((ulong)((long)iStack_160._M_current - (long)local_168) >> 3);
            if ((int)uVar25 < 1) {
LAB_001679dd:
              if (iStack_160._M_current == local_158) {
                std::vector<unsigned_long,std::allocator<unsigned_long>>::
                _M_realloc_insert<unsigned_long_const&>
                          ((vector<unsigned_long,std::allocator<unsigned_long>> *)&local_168,
                           iStack_160,&local_140);
              }
              else {
                *iStack_160._M_current = local_140;
                iStack_160._M_current = iStack_160._M_current + 1;
              }
            }
            else {
              pBVar22 = (BBoxRect *)
                        ((long)local_1a8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                               super__Vector_impl_data._M_start + local_140 * 0x14);
              fVar33 = pBVar22->xmin;
              bVar12 = true;
              uVar30 = 0;
              do {
                uVar10 = local_168[uVar30];
                fVar32 = ((BBoxRect *)
                         ((long)local_1a8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                                super__Vector_impl_data._M_start + uVar10 * 0x14))->xmax;
                fVar34 = 0.0;
                if (fVar33 <= fVar32) {
                  pBVar1 = (BBoxRect *)
                           ((long)local_1a8.super__Vector_base<float,_std::allocator<float>_>.
                                  _M_impl.super__Vector_impl_data._M_start + uVar10 * 0x14);
                  fVar35 = pBVar22->xmax;
                  fVar36 = pBVar1->xmin;
                  if (fVar36 <= fVar35) {
                    fVar2 = pBVar22->ymin;
                    fVar37 = pBVar1->ymax;
                    if (fVar2 <= fVar37) {
                      fVar3 = pBVar22->ymax;
                      fVar38 = pBVar1->ymin;
                      if (fVar38 <= fVar3) {
                        if (fVar35 <= fVar32) {
                          fVar32 = fVar35;
                        }
                        if (fVar36 <= fVar33) {
                          fVar36 = fVar33;
                        }
                        if (fVar3 <= fVar37) {
                          fVar37 = fVar3;
                        }
                        if (fVar38 <= fVar2) {
                          fVar38 = fVar2;
                        }
                        fVar34 = (fVar37 - fVar38) * (fVar32 - fVar36);
                      }
                    }
                  }
                }
                if ((float)local_b8 <
                    fVar34 / ((((float *)local_188)[local_140] - fVar34) +
                             ((float *)local_188)[uVar10])) {
                  bVar12 = false;
                }
                uVar30 = uVar30 + 1;
              } while ((uVar25 & 0x7fffffff) != uVar30);
              if (bVar12) goto LAB_001679dd;
            }
            local_140 = local_140 + 1;
          } while (local_140 < uVar26);
        }
        if (local_188 != (undefined1  [8])0x0) {
          operator_delete((void *)local_188,(long)local_178 - (long)local_188);
        }
        if (iStack_160._M_current != local_168) {
          uVar26 = 0;
          do {
            uVar10 = local_168[uVar26];
            pBVar22 = (BBoxRect *)
                      ((long)local_1a8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                             super__Vector_impl_data._M_start + uVar10 * 0x14);
            this_00 = (vector<ncnn::BBoxRect,std::allocator<ncnn::BBoxRect>> *)
                      (local_48.
                       super__Vector_base<std::vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>,_std::allocator<std::vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start + sVar29);
            __position._M_current = *(BBoxRect **)(this_00 + 8);
            if (__position._M_current == *(BBoxRect **)(this_00 + 0x10)) {
              std::vector<ncnn::BBoxRect,std::allocator<ncnn::BBoxRect>>::
              _M_realloc_insert<ncnn::BBoxRect_const&>(this_00,__position,pBVar22);
            }
            else {
              (__position._M_current)->label = pBVar22->label;
              fVar33 = pBVar22->ymin;
              fVar32 = pBVar22->xmax;
              fVar34 = pBVar22->ymax;
              (__position._M_current)->xmin = pBVar22->xmin;
              (__position._M_current)->ymin = fVar33;
              (__position._M_current)->xmax = fVar32;
              (__position._M_current)->ymax = fVar34;
              *(long *)(this_00 + 8) = *(long *)(this_00 + 8) + 0x14;
            }
            this_01 = (vector<float,std::allocator<float>> *)
                      (local_e8.
                       super__Vector_base<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start + sVar29);
            __position_00._M_current = *(float **)(this_01 + 8);
            if (__position_00._M_current == *(float **)(this_01 + 0x10)) {
              std::vector<float,std::allocator<float>>::_M_realloc_insert<float_const&>
                        (this_01,__position_00,
                         local_138.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                         super__Vector_impl_data._M_start + uVar10);
            }
            else {
              *__position_00._M_current =
                   local_138.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                   super__Vector_impl_data._M_start[uVar10];
              *(float **)(this_01 + 8) = __position_00._M_current + 1;
            }
            uVar26 = uVar26 + 1;
          } while (uVar26 < (ulong)((long)iStack_160._M_current - (long)local_168 >> 3));
        }
        if (local_168 != (unsigned_long *)0x0) {
          operator_delete(local_168,(long)local_158 - (long)local_168);
        }
        sVar16 = local_f8;
        if (local_138.super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_138.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                          super__Vector_impl_data._M_start,
                          (long)local_138.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                                super__Vector_impl_data._M_end_of_storage -
                          (long)local_138.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                                super__Vector_impl_data._M_start);
        }
        if ((BBoxRect *)
            local_1a8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_start != (BBoxRect *)0x0) {
          operator_delete(local_1a8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                          super__Vector_impl_data._M_start,
                          (long)local_1a8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                                super__Vector_impl_data._M_end_of_storage -
                          (long)local_1a8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                                super__Vector_impl_data._M_start);
        }
        sVar29 = sVar29 + 1;
        local_108 = local_108 + local_c8;
      } while (sVar29 != sVar16);
      local_188 = (undefined1  [8])0x0;
      uStack_180 = (pointer)0x0;
      local_178 = (pointer)0x0;
      local_1a8.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage = (pointer)0x0;
      local_1a8.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_start = (pointer)0x0;
      local_1a8.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_finish = (pointer)0x0;
      if (1 < (int)sVar16) {
        lVar24 = 0;
        do {
          pvVar17 = local_e8.
                    super__Vector_base<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          std::vector<ncnn::BBoxRect,std::allocator<ncnn::BBoxRect>>::
          _M_range_insert<__gnu_cxx::__normal_iterator<ncnn::BBoxRect_const*,std::vector<ncnn::BBoxRect,std::allocator<ncnn::BBoxRect>>>>
                    ((vector<ncnn::BBoxRect,std::allocator<ncnn::BBoxRect>> *)local_188,uStack_180,
                     *(undefined8 *)
                      ((long)&local_48.
                              super__Vector_base<std::vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>,_std::allocator<std::vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_start[1].
                              super__Vector_base<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>.
                              _M_impl.super__Vector_impl_data._M_start + lVar24),
                     *(undefined8 *)
                      ((long)&local_48.
                              super__Vector_base<std::vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>,_std::allocator<std::vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_start[1].
                              super__Vector_base<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>.
                              _M_impl.super__Vector_impl_data._M_finish + lVar24));
          std::vector<float,std::allocator<float>>::
          _M_range_insert<__gnu_cxx::__normal_iterator<float_const*,std::vector<float,std::allocator<float>>>>
                    ((vector<float,std::allocator<float>> *)&local_1a8,
                     local_1a8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                     super__Vector_impl_data._M_finish,
                     *(undefined8 *)
                      ((long)&pvVar17[1].super__Vector_base<float,_std::allocator<float>_>._M_impl.
                              super__Vector_impl_data._M_start + lVar24),
                     *(undefined8 *)
                      ((long)&pvVar17[1].super__Vector_base<float,_std::allocator<float>_>._M_impl.
                              super__Vector_impl_data._M_finish + lVar24));
          lVar24 = lVar24 + 0x18;
        } while (sVar16 * 0x18 + -0x18 != lVar24);
      }
    }
    qsort_descent_inplace<ncnn::BBoxRect>
              ((vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_> *)local_188,&local_1a8);
    pDVar15 = local_148;
    iVar23 = local_148->keep_top_k;
    iVar18 = (int)((ulong)((long)uStack_180 - (long)local_188) >> 2);
    uVar25 = iVar18 * -0x33333333;
    if (SBORROW4(iVar23,uVar25) != iVar23 + iVar18 * 0x33333333 < 0) {
      std::vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>::resize
                ((vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_> *)local_188,(long)iVar23);
      std::vector<float,_std::allocator<float>_>::resize(&local_1a8,(long)pDVar15->keep_top_k);
      uVar25 = (int)((ulong)((long)uStack_180 - (long)local_188) >> 2) * -0x33333333;
    }
    iVar23 = 0;
    if (uVar25 != 0) {
      this_02 = (local_68->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
                super__Vector_impl_data._M_start;
      Mat::create(this_02,6,uVar25,4,local_60->blob_allocator);
      iVar23 = -100;
      if (((this_02->data != (void *)0x0) && ((long)this_02->c * this_02->cstep != 0)) &&
         (iVar23 = 0, 0 < (int)uVar25)) {
        iVar18 = this_02->w;
        sVar11 = this_02->elemsize;
        pfVar21 = (float *)((long)this_02->data + 0x14);
        piVar19 = (int *)((long)local_188 + 0x10);
        iVar23 = 0;
        uVar26 = 0;
        do {
          fVar33 = local_1a8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                   super__Vector_impl_data._M_start[uVar26];
          pfVar21[-5] = (float)*piVar19;
          pfVar21[-4] = fVar33;
          pfVar21[-3] = ((BBoxRect *)(piVar19 + -4))->xmin;
          pfVar21[-2] = (float)piVar19[-3];
          pfVar21[-1] = (float)piVar19[-2];
          *pfVar21 = (float)piVar19[-1];
          uVar26 = uVar26 + 1;
          pfVar21 = (float *)((long)pfVar21 + (long)iVar18 * sVar11);
          piVar19 = piVar19 + 5;
        } while (uVar25 != uVar26);
      }
    }
    if (local_1a8.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
        _M_start != (pointer)0x0) {
      operator_delete(local_1a8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_1a8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)local_1a8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
    if (local_188 != (undefined1  [8])0x0) {
      operator_delete((void *)local_188,(long)local_178 - (long)local_188);
    }
    std::
    vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
    ::~vector(&local_e8);
    std::
    vector<std::vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>,_std::allocator<std::vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>_>_>
    ::~vector(&local_48);
    LOCK();
    *local_58 = (float)((int)*local_58 + -1);
    UNLOCK();
    if (*local_58 == 0.0) {
      if (local_88 == (Allocator *)0x0) {
        if (local_a8 != (pointer)0x0) {
          free(local_a8);
        }
      }
      else {
        (**(code **)(*(long *)local_88 + 0x18))();
      }
    }
  }
  return iVar23;
}

Assistant:

int DetectionOutput::forward(const std::vector<Mat>& bottom_blobs, std::vector<Mat>& top_blobs, const Option& opt) const
{
    const Mat& location = bottom_blobs[0];
    const Mat& confidence = bottom_blobs[1];
    const Mat& priorbox = bottom_blobs[2];

    bool mxnet_ssd_style = num_class == -233;

    // mxnet-ssd _contrib_MultiBoxDetection
    const int num_prior = mxnet_ssd_style ? priorbox.h : priorbox.w / 4;

    int num_class_copy = mxnet_ssd_style ? confidence.h : num_class;

    // apply location with priorbox
    Mat bboxes;
    bboxes.create(4, num_prior, 4u, opt.workspace_allocator);
    if (bboxes.empty())
        return -100;

    const float* location_ptr = location;
    const float* priorbox_ptr = priorbox.row(0);
    const float* variance_ptr = mxnet_ssd_style ? 0 : priorbox.row(1);

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int i = 0; i < num_prior; i++)
    {
        const float* loc = location_ptr + i * 4;
        const float* pb = priorbox_ptr + i * 4;
        const float* var = variance_ptr ? variance_ptr + i * 4 : variances;

        float* bbox = bboxes.row(i);

        // CENTER_SIZE
        float pb_w = pb[2] - pb[0];
        float pb_h = pb[3] - pb[1];
        float pb_cx = (pb[0] + pb[2]) * 0.5f;
        float pb_cy = (pb[1] + pb[3]) * 0.5f;

        float bbox_cx = var[0] * loc[0] * pb_w + pb_cx;
        float bbox_cy = var[1] * loc[1] * pb_h + pb_cy;
        float bbox_w = static_cast<float>(exp(var[2] * loc[2]) * pb_w);
        float bbox_h = static_cast<float>(exp(var[3] * loc[3]) * pb_h);

        bbox[0] = bbox_cx - bbox_w * 0.5f;
        bbox[1] = bbox_cy - bbox_h * 0.5f;
        bbox[2] = bbox_cx + bbox_w * 0.5f;
        bbox[3] = bbox_cy + bbox_h * 0.5f;
    }

    // sort and nms for each class
    std::vector< std::vector<BBoxRect> > all_class_bbox_rects;
    std::vector< std::vector<float> > all_class_bbox_scores;
    all_class_bbox_rects.resize(num_class_copy);
    all_class_bbox_scores.resize(num_class_copy);

    // start from 1 to ignore background class
    #pragma omp parallel for num_threads(opt.num_threads)
    for (int i = 1; i < num_class_copy; i++)
    {
        // filter by confidence_threshold
        std::vector<BBoxRect> class_bbox_rects;
        std::vector<float> class_bbox_scores;

        for (int j = 0; j < num_prior; j++)
        {
            // prob data layout
            // caffe-ssd = num_class x num_prior
            // mxnet-ssd = num_prior x num_class
            float score = mxnet_ssd_style ? confidence[i * num_prior + j] : confidence[j * num_class_copy + i];

            if (score > confidence_threshold)
            {
                const float* bbox = bboxes.row(j);
                BBoxRect c = { bbox[0], bbox[1], bbox[2], bbox[3], i };
                class_bbox_rects.push_back(c);
                class_bbox_scores.push_back(score);
            }
        }

        // sort inplace
        qsort_descent_inplace(class_bbox_rects, class_bbox_scores);

        // keep nms_top_k
        if (nms_top_k < (int)class_bbox_rects.size())
        {
            class_bbox_rects.resize(nms_top_k);
            class_bbox_scores.resize(nms_top_k);
        }

        // apply nms
        std::vector<size_t> picked;
        nms_sorted_bboxes(class_bbox_rects, picked, nms_threshold);

        // select
        for (size_t j = 0; j < picked.size(); j++)
        {
            size_t z = picked[j];
            all_class_bbox_rects[i].push_back(class_bbox_rects[z]);
            all_class_bbox_scores[i].push_back(class_bbox_scores[z]);
        }
    }

    // gather all class
    std::vector<BBoxRect> bbox_rects;
    std::vector<float> bbox_scores;

    for (int i = 1; i < num_class_copy; i++)
    {
        const std::vector<BBoxRect>& class_bbox_rects = all_class_bbox_rects[i];
        const std::vector<float>& class_bbox_scores = all_class_bbox_scores[i];

        bbox_rects.insert(bbox_rects.end(), class_bbox_rects.begin(), class_bbox_rects.end());
        bbox_scores.insert(bbox_scores.end(), class_bbox_scores.begin(), class_bbox_scores.end());
    }

    // global sort inplace
    qsort_descent_inplace(bbox_rects, bbox_scores);

    // keep_top_k
    if (keep_top_k < (int)bbox_rects.size())
    {
        bbox_rects.resize(keep_top_k);
        bbox_scores.resize(keep_top_k);
    }

    // fill result
    int num_detected = static_cast<int>(bbox_rects.size());
    if (num_detected == 0)
        return 0;

    Mat& top_blob = top_blobs[0];
    top_blob.create(6, num_detected, 4u, opt.blob_allocator);
    if (top_blob.empty())
        return -100;

    for (int i = 0; i < num_detected; i++)
    {
        const BBoxRect& r = bbox_rects[i];
        float score = bbox_scores[i];
        float* outptr = top_blob.row(i);

        outptr[0] = static_cast<float>(r.label);
        outptr[1] = score;
        outptr[2] = r.xmin;
        outptr[3] = r.ymin;
        outptr[4] = r.xmax;
        outptr[5] = r.ymax;
    }

    return 0;
}